

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

string * __thiscall Tokenizer::readName_abi_cxx11_(string *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  long *plVar4;
  bool bVar5;
  char local_1a;
  char c;
  Tokenizer *this_local;
  string *name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    plVar4 = (long *)std::istream::get((char *)this->inStream);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    bVar5 = false;
    if (bVar1) {
      iVar3 = isalnum((int)local_1a);
      bVar5 = iVar3 != 0;
    }
    if (!bVar5) break;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_1a);
  }
  bVar2 = std::ios::good();
  if ((bVar2 & 1) != 0) {
    std::istream::putback((char)this->inStream);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::readName() {
    // This function is called when it is known that
    // the first character in input is an alphabetic character.
    // The function reads and returns all characters of the name.

    std::string name;
    char c;
    while( inStream.get(c) && isalnum(c) ) {
        name += c;
    }
    if(inStream.good())  // In the loop, we have read one char too many.
        inStream.putback(c);
    return name;
}